

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O3

int cfg_schema_tobin(void *target,cfg_named_section *named,cfg_schema_entry *entries,size_t count)

{
  int iVar1;
  const_strarray *pcVar2;
  size_t sVar3;
  
  if (count != 0) {
    sVar3 = 0;
    do {
      if (entries->cb_to_binary != (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0
         ) {
        pcVar2 = cfg_db_get_schema_entry_value(named,entries);
        iVar1 = (*entries->cb_to_binary)
                          (entries,pcVar2,(void *)(entries->bin_offset + (long)target));
        if (iVar1 != 0) {
          return ~(uint)sVar3;
        }
      }
      sVar3 = sVar3 + 1;
      entries = entries + 1;
    } while (count != sVar3);
  }
  return 0;
}

Assistant:

int
cfg_schema_tobin(void *target, struct cfg_named_section *named, const struct cfg_schema_entry *entries, size_t count) {
  char *ptr;
  size_t i;
  const struct const_strarray *value;

  ptr = (char *)target;

  for (i = 0; i < count; i++) {
    if (entries[i].cb_to_binary == NULL) {
      continue;
    }

    value = cfg_db_get_schema_entry_value(named, &entries[i]);
    if (entries[i].cb_to_binary(&entries[i], value, ptr + entries[i].bin_offset)) {
      /* error in conversion */
      return -1 - i;
    }
  }
  return 0;
}